

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O1

void Wln_NtkStartFaninMap(Wln_Ntk_t *p,Vec_Int_t *vFaninMap,int nMulti)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = (p->vTypes).nSize;
  uVar7 = (ulong)(int)uVar6;
  iVar4 = 0;
  if (1 < (long)uVar7) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + *(int *)((long)&p->vFanins[1].nSize + lVar3);
      lVar3 = lVar3 + 0x10;
    } while (uVar7 * 0x10 + -0x10 != lVar3);
  }
  uVar5 = iVar4 * nMulti + uVar6;
  if (vFaninMap->nCap < (int)uVar5) {
    if (vFaninMap->pArray == (int *)0x0) {
      piVar1 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar1 = (int *)realloc(vFaninMap->pArray,(long)(int)uVar5 << 2);
    }
    vFaninMap->pArray = piVar1;
    if (piVar1 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFaninMap->nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset(vFaninMap->pArray,0,(ulong)uVar5 << 2);
  }
  vFaninMap->nSize = uVar5;
  if (1 < (p->vTypes).nSize) {
    lVar3 = 1;
    lVar2 = 0x14;
    do {
      if (vFaninMap->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vFaninMap->pArray[lVar3] = (int)uVar7;
      uVar6 = (int)uVar7 + *(int *)((long)&p->vFanins->nCap + lVar2) * nMulti;
      uVar7 = (ulong)uVar6;
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < (p->vTypes).nSize);
  }
  if (uVar6 == vFaninMap->nSize) {
    return;
  }
  __assert_fail("iOffset == Vec_IntSize(vFaninMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNtk.c"
                ,0xfb,"void Wln_NtkStartFaninMap(Wln_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

void Wln_NtkStartFaninMap( Wln_Ntk_t * p, Vec_Int_t * vFaninMap, int nMulti )
{
    int iObj, iOffset = Wln_NtkObjNum(p);
    Vec_IntFill( vFaninMap, iOffset + nMulti * Wln_NtkFaninNum(p), 0 );
    Wln_NtkForEachObj( p, iObj )
    {
        Vec_IntWriteEntry( vFaninMap, iObj, iOffset );
        iOffset += nMulti * Wln_ObjFaninNum(p, iObj);
    }
    assert( iOffset == Vec_IntSize(vFaninMap) );
}